

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

target_ulong_conflict exception_resume_pc_mipsel(CPUMIPSState_conflict2 *env)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = env->hflags;
  uVar2 = uVar1 >> 0xd & 2 | 0xfffffffc;
  if ((uVar1 & 0x87f800) == 0) {
    uVar2 = 0;
  }
  return uVar2 + (uVar1 >> 10 & 1 | (env->active_tc).PC);
}

Assistant:

target_ulong exception_resume_pc(CPUMIPSState *env)
{
    target_ulong bad_pc;
    target_ulong isa_mode;

    isa_mode = !!(env->hflags & MIPS_HFLAG_M16);
    bad_pc = env->active_tc.PC | isa_mode;
    if (env->hflags & MIPS_HFLAG_BMASK) {
        /*
         * If the exception was raised from a delay slot, come back to
         * the jump.
         */
        bad_pc -= (env->hflags & MIPS_HFLAG_B16 ? 2 : 4);
    }

    return bad_pc;
}